

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O0

int wave_add_generic(uint numPulses,gpioPulse_t *pulses)

{
  undefined8 in_RSI;
  uint in_EDI;
  gpioExtent_t *unaff_retaddr;
  int in_stack_00000008;
  gpioExtent_t ext [1];
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  undefined4 local_4;
  
  if (in_EDI == 0) {
    local_4 = 0;
  }
  else {
    local_4 = pigpio_command_ext((int)in_RSI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                                 (int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                                 (int)((ulong)in_EDI * 0xc >> 0x20),unaff_retaddr,in_stack_00000008)
    ;
  }
  return local_4;
}

Assistant:

int wave_add_generic(unsigned numPulses, gpioPulse_t *pulses)
{
   gpioExtent_t ext[1];
   
   /*
   p1=0
   p2=0
   p3=pulses*sizeof(gpioPulse_t)
   ## extension ##
   gpioPulse_t[] pulses
   */

   if (!numPulses) return 0;

   ext[0].size = numPulses * sizeof(gpioPulse_t);
   ext[0].ptr = pulses;

   return pigpio_command_ext(
      gPigCommand, PI_CMD_WVAG, 0, 0, ext[0].size, 1, ext, 1);
}